

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCD.h
# Opt level: O2

void __thiscall
dg::llvmdg::SCD::SCD(SCD *this,Module *module,LLVMControlDependenceAnalysisOptions *opts)

{
  _Rb_tree_header *p_Var1;
  LLVMControlDependenceAnalysisOptions LStack_78;
  
  LLVMControlDependenceAnalysisOptions::LLVMControlDependenceAnalysisOptions(&LStack_78,opts);
  LLVMControlDependenceAnalysisImpl::LLVMControlDependenceAnalysisImpl
            (&this->super_LLVMControlDependenceAnalysisImpl,module,&LStack_78);
  LLVMControlDependenceAnalysisOptions::~LLVMControlDependenceAnalysisOptions(&LStack_78);
  (this->super_LLVMControlDependenceAnalysisImpl)._vptr_LLVMControlDependenceAnalysisImpl =
       (_func_int **)&PTR__SCD_00173a20;
  (this->dependentBlocks)._M_h._M_buckets = &(this->dependentBlocks)._M_h._M_single_bucket;
  (this->dependentBlocks)._M_h._M_bucket_count = 1;
  (this->dependentBlocks)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->dependentBlocks)._M_h._M_element_count = 0;
  (this->dependentBlocks)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->dependentBlocks)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->dependentBlocks)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->dependencies)._M_h._M_buckets = &(this->dependencies)._M_h._M_single_bucket;
  (this->dependencies)._M_h._M_bucket_count = 1;
  (this->dependencies)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->dependencies)._M_h._M_element_count = 0;
  (this->dependencies)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->dependencies)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->dependencies)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  p_Var1 = &(this->_computed)._M_t._M_impl.super__Rb_tree_header;
  (this->_computed)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_computed)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_computed)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->_computed)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->_computed)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

SCD(const llvm::Module *module,
        const LLVMControlDependenceAnalysisOptions &opts = {})
            : LLVMControlDependenceAnalysisImpl(module, opts) {}